

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  byte *pbVar1;
  Btree *p;
  bool bVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  sqlite3BtreeEnterAll(db);
  bVar2 = false;
  bVar5 = false;
  if ((db->mDbFlags & 1) != 0) {
    bVar5 = (db->init).busy == '\0';
  }
  lVar4 = 8;
  for (lVar3 = 0; lVar3 < db->nDb; lVar3 = lVar3 + 1) {
    p = *(Btree **)((long)&db->aDb->zDbSName + lVar4);
    if (p != (Btree *)0x0) {
      if (p->inTrans == '\x02') {
        bVar2 = true;
      }
      sqlite3BtreeRollback(p,tripCode,(uint)(bVar5 ^ 1));
    }
    lVar4 = lVar4 + 0x20;
  }
  sqlite3VtabRollback(db);
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (bVar5 != false) {
    sqlite3ExpirePreparedStatements(db,0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  pbVar1 = (byte *)((long)&db->flags + 2);
  *pbVar1 = *pbVar1 & 0xf7;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) && ((bVar2 || (db->autoCommit == '\0')))
     ) {
    (*db->xRollbackCallback)(db->pRollbackArg);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback(). 
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->mDbFlags & DBFLAG_SchemaChange)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeIsInTrans(p) ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( schemaChange ){
    sqlite3ExpirePreparedStatements(db, 0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~(u64)SQLITE_DeferFKs;

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}